

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AppendFeatureOptions
          (cmLocalGenerator *this,string *flags,string *lang,char *feature)

{
  cmMakefile *this_00;
  char *pcVar1;
  cmValue cVar2;
  string *o;
  char *pcVar3;
  string_view arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  char *local_a8;
  string local_a0;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  this_00 = this->Makefile;
  local_80.View_._M_len = (size_t)&DAT_00000006;
  local_80.View_._M_str = "CMAKE_";
  local_50.View_._M_str = (lang->_M_dataplus)._M_p;
  local_50.View_._M_len = lang->_M_string_length;
  local_a8 = feature;
  cmStrCat<char[18],char_const*>
            (&local_a0,&local_80,&local_50,(char (*) [18])"_COMPILE_OPTIONS_",&local_a8);
  cVar2 = cmMakefile::GetDefinition(this_00,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  if (cVar2.Value != (string *)0x0) {
    arg._M_str = ((cVar2.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar2.Value)->_M_string_length;
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_80,arg,false);
    pcVar1 = local_80.View_._M_str;
    for (pcVar3 = (char *)local_80.View_._M_len; pcVar3 != pcVar1; pcVar3 = pcVar3 + 0x20) {
      (*this->_vptr_cmLocalGenerator[8])(this,flags,pcVar3);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_80);
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendFeatureOptions(std::string& flags,
                                            const std::string& lang,
                                            const char* feature)
{
  cmValue optionList = this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", lang, "_COMPILE_OPTIONS_", feature));
  if (optionList) {
    std::vector<std::string> options = cmExpandedList(*optionList);
    for (std::string const& o : options) {
      this->AppendFlagEscape(flags, o);
    }
  }
}